

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O1

bool __thiscall
OSSLRSA::signInit(OSSLRSA *this,PrivateKey *privateKey,Type mechanism,void *param,size_t paramLen)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  CryptoFactory *pCVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar9;
  undefined8 uVar10;
  ByteString dummy;
  ByteString local_58;
  HashAlgorithm *pHVar8;
  
  bVar3 = AsymmetricAlgorithm::signInit
                    (&this->super_AsymmetricAlgorithm,privateKey,mechanism,param,paramLen);
  if (!bVar3) {
    return false;
  }
  cVar4 = (**(code **)(*(long *)privateKey + 0x18))(privateKey,OSSLRSAPrivateKey::type);
  if (cVar4 == '\0') {
    softHSMLog(3,"signInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0x129,"Invalid key type supplied");
    ByteString::ByteString(&local_58);
    AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
  }
  else {
    uVar10 = 1;
    switch(mechanism) {
    case RSA_MD5_PKCS:
      bVar3 = true;
      uVar9 = 0;
      break;
    default:
      softHSMLog(3,"signInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x1b6,"Invalid mechanism supplied (%i)",(ulong)mechanism);
      ByteString::ByteString(&local_58);
      AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
      goto LAB_0015d602;
    case RSA_SHA1_PKCS:
      bVar3 = true;
      uVar9 = 0;
      uVar10 = 2;
      break;
    case RSA_SHA224_PKCS:
      bVar3 = true;
      uVar9 = 0;
      uVar10 = 3;
      break;
    case RSA_SHA256_PKCS:
      bVar3 = true;
      uVar9 = 0;
      uVar10 = 4;
      break;
    case RSA_SHA384_PKCS:
      bVar3 = true;
      uVar9 = 0;
      uVar10 = 5;
      break;
    case RSA_SHA512_PKCS:
      bVar3 = true;
      uVar9 = 0;
      uVar10 = 6;
      break;
    case RSA_SHA1_PKCS_PSS:
      if (((paramLen != 0x10 || param == (void *)0x0) || (*param != 2)) ||
         (*(int *)((long)param + 4) != 1)) {
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x14d,"Invalid parameters");
        ByteString::ByteString(&local_58);
        AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
        goto LAB_0015d602;
      }
      bVar3 = true;
      uVar9 = 0;
      uVar1 = *(ulong *)((long)param + 8);
      this->sLen = uVar1;
      lVar6 = (**(code **)(*(long *)privateKey + 0x20))(privateKey);
      uVar10 = 2;
      if ((lVar6 + 6U >> 3) - 0x16 < uVar1) {
        sVar2 = this->sLen;
        uVar10 = (**(code **)(*(long *)privateKey + 0x20))(privateKey);
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x156,"sLen (%lu) is too large for current key size (%lu)",sVar2,uVar10);
        ByteString::ByteString(&local_58);
        AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
        goto LAB_0015d602;
      }
      break;
    case RSA_SHA224_PKCS_PSS:
      if (((paramLen != 0x10 || param == (void *)0x0) || (*param != 3)) ||
         (*(int *)((long)param + 4) != 2)) {
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x162,"Invalid parameters");
        ByteString::ByteString(&local_58);
        AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
        goto LAB_0015d602;
      }
      bVar3 = true;
      uVar9 = 0;
      uVar1 = *(ulong *)((long)param + 8);
      this->sLen = uVar1;
      lVar6 = (**(code **)(*(long *)privateKey + 0x20))(privateKey);
      uVar10 = 3;
      if ((lVar6 + 6U >> 3) - 0x1e < uVar1) {
        sVar2 = this->sLen;
        uVar10 = (**(code **)(*(long *)privateKey + 0x20))(privateKey);
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x16b,"sLen (%lu) is too large for current key size (%lu)",sVar2,uVar10);
        ByteString::ByteString(&local_58);
        AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
        goto LAB_0015d602;
      }
      break;
    case RSA_SHA256_PKCS_PSS:
      if (((paramLen != 0x10 || param == (void *)0x0) || (*param != 4)) ||
         (*(int *)((long)param + 4) != 3)) {
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x177,"Invalid parameters");
        ByteString::ByteString(&local_58);
        AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
        goto LAB_0015d602;
      }
      bVar3 = true;
      uVar9 = 0;
      uVar1 = *(ulong *)((long)param + 8);
      this->sLen = uVar1;
      lVar6 = (**(code **)(*(long *)privateKey + 0x20))(privateKey);
      uVar10 = 4;
      if ((lVar6 + 6U >> 3) - 0x22 < uVar1) {
        sVar2 = this->sLen;
        uVar10 = (**(code **)(*(long *)privateKey + 0x20))(privateKey);
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x180,"sLen (%lu) is too large for current key size (%lu)",sVar2,uVar10);
        ByteString::ByteString(&local_58);
        AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
        goto LAB_0015d602;
      }
      break;
    case RSA_SHA384_PKCS_PSS:
      if (((paramLen != 0x10 || param == (void *)0x0) || (*param != 5)) ||
         (*(int *)((long)param + 4) != 4)) {
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x18c,"Invalid parameters");
        ByteString::ByteString(&local_58);
        AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
        goto LAB_0015d602;
      }
      bVar3 = true;
      uVar9 = 0;
      uVar1 = *(ulong *)((long)param + 8);
      this->sLen = uVar1;
      lVar6 = (**(code **)(*(long *)privateKey + 0x20))(privateKey);
      uVar10 = 5;
      if ((lVar6 + 6U >> 3) - 0x32 < uVar1) {
        sVar2 = this->sLen;
        uVar10 = (**(code **)(*(long *)privateKey + 0x20))(privateKey);
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x195,"sLen (%lu) is too large for current key size (%lu)",sVar2,uVar10);
        ByteString::ByteString(&local_58);
        AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
        goto LAB_0015d602;
      }
      break;
    case RSA_SHA512_PKCS_PSS:
      if (((paramLen != 0x10 || param == (void *)0x0) || (*param != 6)) ||
         (*(int *)((long)param + 4) != 5)) {
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x1a1,"Invalid parameters");
        ByteString::ByteString(&local_58);
        AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
        goto LAB_0015d602;
      }
      bVar3 = true;
      uVar9 = 0;
      uVar1 = *(ulong *)((long)param + 8);
      this->sLen = uVar1;
      lVar6 = (**(code **)(*(long *)privateKey + 0x20))(privateKey);
      uVar10 = 6;
      if ((lVar6 + 6U >> 3) - 0x42 < uVar1) {
        sVar2 = this->sLen;
        uVar10 = (**(code **)(*(long *)privateKey + 0x20))(privateKey);
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x1aa,"sLen (%lu) is too large for current key size (%lu)",sVar2,uVar10);
        ByteString::ByteString(&local_58);
        AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
        goto LAB_0015d602;
      }
      break;
    case RSA_SSL:
      uVar9 = 2;
      bVar3 = false;
    }
    pCVar7 = CryptoFactory::i();
    iVar5 = (*pCVar7->_vptr_CryptoFactory[4])(pCVar7,uVar10);
    pHVar8 = (HashAlgorithm *)CONCAT44(extraout_var,iVar5);
    this->pCurrentHash = pHVar8;
    if ((pHVar8 == (HashAlgorithm *)0x0) ||
       (iVar5 = (*pHVar8->_vptr_HashAlgorithm[2])(pHVar8), (char)iVar5 == '\0')) {
      if (this->pCurrentHash != (HashAlgorithm *)0x0) {
        (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
        this->pCurrentHash = (HashAlgorithm *)0x0;
      }
      ByteString::ByteString(&local_58);
      AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
    }
    else {
      if (bVar3) {
        return true;
      }
      pCVar7 = CryptoFactory::i();
      iVar5 = (*pCVar7->_vptr_CryptoFactory[4])(pCVar7,(ulong)uVar9);
      pHVar8 = (HashAlgorithm *)CONCAT44(extraout_var_00,iVar5);
      this->pSecondHash = pHVar8;
      if ((pHVar8 != (HashAlgorithm *)0x0) &&
         (iVar5 = (*pHVar8->_vptr_HashAlgorithm[2])(pHVar8), (char)iVar5 != '\0')) {
        return true;
      }
      if (this->pCurrentHash != (HashAlgorithm *)0x0) {
        (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
      }
      this->pCurrentHash = (HashAlgorithm *)0x0;
      if (this->pSecondHash != (HashAlgorithm *)0x0) {
        (*this->pSecondHash->_vptr_HashAlgorithm[1])();
        this->pSecondHash = (HashAlgorithm *)0x0;
      }
      ByteString::ByteString(&local_58);
      AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_58);
    }
  }
LAB_0015d602:
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return false;
}

Assistant:

bool OSSLRSA::signInit(PrivateKey* privateKey, const AsymMech::Type mechanism,
		       const void* param /* = NULL */, const size_t paramLen /* = 0 */)
{
	if (!AsymmetricAlgorithm::signInit(privateKey, mechanism, param, paramLen))
	{
		return false;
	}

	// Check if the private key is the right type
	if (!privateKey->isOfType(OSSLRSAPrivateKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		ByteString dummy;
		AsymmetricAlgorithm::signFinal(dummy);

		return false;
	}

	HashAlgo::Type hash1 = HashAlgo::Unknown;
	HashAlgo::Type hash2 = HashAlgo::Unknown;

	switch (mechanism)
	{
		case AsymMech::RSA_MD5_PKCS:
			hash1 = HashAlgo::MD5;
			break;
		case AsymMech::RSA_SHA1_PKCS:
			hash1 = HashAlgo::SHA1;
			break;
		case AsymMech::RSA_SHA224_PKCS:
			hash1 = HashAlgo::SHA224;
			break;
		case AsymMech::RSA_SHA256_PKCS:
			hash1 = HashAlgo::SHA256;
			break;
		case AsymMech::RSA_SHA384_PKCS:
			hash1 = HashAlgo::SHA384;
			break;
		case AsymMech::RSA_SHA512_PKCS:
			hash1 = HashAlgo::SHA512;
			break;
		case AsymMech::RSA_SHA1_PKCS_PSS:
			if (param == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS) ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->hashAlg != HashAlgo::SHA1 ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->mgf != AsymRSAMGF::MGF1_SHA1)
			{
				ERROR_MSG("Invalid parameters");
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			sLen = ((RSA_PKCS_PSS_PARAMS*) param)->sLen;
			if (sLen > ((privateKey->getBitLength()+6)/8-2-20))
			{
				ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
					  (unsigned long)sLen, privateKey->getBitLength());
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			hash1 = HashAlgo::SHA1;
			break;
		case AsymMech::RSA_SHA224_PKCS_PSS:
			if (param == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS) ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->hashAlg != HashAlgo::SHA224 ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->mgf != AsymRSAMGF::MGF1_SHA224)
			{
				ERROR_MSG("Invalid parameters");
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			sLen = ((RSA_PKCS_PSS_PARAMS*) param)->sLen;
			if (sLen > ((privateKey->getBitLength()+6)/8-2-28))
			{
				ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
					  (unsigned long)sLen, privateKey->getBitLength());
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			hash1 = HashAlgo::SHA224;
			break;
		case AsymMech::RSA_SHA256_PKCS_PSS:
			if (param == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS) ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->hashAlg != HashAlgo::SHA256 ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->mgf != AsymRSAMGF::MGF1_SHA256)
			{
				ERROR_MSG("Invalid parameters");
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			sLen = ((RSA_PKCS_PSS_PARAMS*) param)->sLen;
			if (sLen > ((privateKey->getBitLength()+6)/8-2-32))
			{
				ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
					  (unsigned long)sLen, privateKey->getBitLength());
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			hash1 = HashAlgo::SHA256;
			break;
		case AsymMech::RSA_SHA384_PKCS_PSS:
			if (param == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS) ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->hashAlg != HashAlgo::SHA384 ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->mgf != AsymRSAMGF::MGF1_SHA384)
			{
				ERROR_MSG("Invalid parameters");
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			sLen = ((RSA_PKCS_PSS_PARAMS*) param)->sLen;
			if (sLen > ((privateKey->getBitLength()+6)/8-2-48))
			{
				ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
					  (unsigned long)sLen, privateKey->getBitLength());
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			hash1 = HashAlgo::SHA384;
			break;
		case AsymMech::RSA_SHA512_PKCS_PSS:
			if (param == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS) ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->hashAlg != HashAlgo::SHA512 ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->mgf != AsymRSAMGF::MGF1_SHA512)
			{
				ERROR_MSG("Invalid parameters");
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			sLen = ((RSA_PKCS_PSS_PARAMS*) param)->sLen;
			if (sLen > ((privateKey->getBitLength()+6)/8-2-64))
			{
				ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
					  (unsigned long)sLen, privateKey->getBitLength());
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			hash1 = HashAlgo::SHA512;
			break;
		case AsymMech::RSA_SSL:
			hash1 = HashAlgo::MD5;
			hash2 = HashAlgo::SHA1;
			break;
		default:
			ERROR_MSG("Invalid mechanism supplied (%i)", mechanism);

			ByteString dummy;
			AsymmetricAlgorithm::signFinal(dummy);

			return false;
	}

	pCurrentHash = CryptoFactory::i()->getHashAlgorithm(hash1);

	if (pCurrentHash == NULL || !pCurrentHash->hashInit())
	{
		if (pCurrentHash != NULL)
		{
			delete pCurrentHash;
			pCurrentHash = NULL;
		}

		ByteString dummy;
		AsymmetricAlgorithm::signFinal(dummy);

		return false;
	}

	if (hash2 != HashAlgo::Unknown)
	{
		pSecondHash = CryptoFactory::i()->getHashAlgorithm(hash2);

		if (pSecondHash == NULL || !pSecondHash->hashInit())
		{
			delete pCurrentHash;
			pCurrentHash = NULL;

			if (pSecondHash != NULL)
			{
				delete pSecondHash;
				pSecondHash = NULL;
			}

			ByteString dummy;
			AsymmetricAlgorithm::signFinal(dummy);

			return false;
		}
	}

	return true;
}